

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

const_iterator __thiscall
VulkanHppGenerator::findSupportedExtension(VulkanHppGenerator *this,string *name)

{
  ExtensionData *pEVar1;
  __type_conflict _Var2;
  ExtensionData *pEVar3;
  
  pEVar3 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pEVar3 == pEVar1) {
      return (const_iterator)pEVar3;
    }
    _Var2 = std::operator==(&pEVar3->name,name);
    if (_Var2) break;
    pEVar3 = pEVar3 + 1;
  }
  return (const_iterator)pEVar3;
}

Assistant:

std::vector<VulkanHppGenerator::ExtensionData>::const_iterator VulkanHppGenerator::findSupportedExtension( std::string const & name ) const
{
  return std::ranges::find_if( m_extensions, [&name]( ExtensionData const & ed ) { return ed.name == name; } );
}